

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::PrintValue<std::vector<int,std::allocator<int>>,void>
               (vector<int,_std::allocator<int>_> *container,ostream *os)

{
  pointer piVar1;
  long lVar2;
  pointer value;
  
  std::operator<<(os,'{');
  value = (container->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
          ._M_start;
  piVar1 = (container->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar2 = 0;
  do {
    if (value == piVar1) {
      if (lVar2 != 0) {
LAB_001a1b31:
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    if ((lVar2 != 0) && (std::operator<<(os,','), lVar2 == 0x20)) {
      std::operator<<(os," ...");
      goto LAB_001a1b31;
    }
    std::operator<<(os,' ');
    internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
    PrintValue<int,void,std::ostream&>(value,os);
    lVar2 = lVar2 + 1;
    value = value + 1;
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }